

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O1

bool crnlib::texture_conversion::process(convert_params *params,convert_stats *stats)

{
  format fVar1;
  format fVar2;
  mipmapped_texture *pmVar3;
  mip_level *other;
  void *p;
  vector<crnlib::mip_level_*> *pvVar4;
  bool bVar5;
  bool bVar6;
  pixel_format pVar7;
  int iVar8;
  mipmapped_texture *this;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  mip_level *this_00;
  long lVar12;
  double dVar13;
  crn_mipmap_params *pcVar14;
  crn_mipmap_params *pcVar15;
  texture_type tVar16;
  pixel_format pVar17;
  byte bVar18;
  face_vec face;
  dynamic_string fn;
  pack_params pack_params;
  progress_params progress_state;
  dynamic_string ext;
  dynamic_string dir;
  dynamic_string drv;
  timer tm;
  crn_mipmap_params mipmap_params;
  timer t;
  crn_comp_params comp_params;
  ulong local_510;
  vector<crnlib::mip_level_*> *local_4f8;
  char *pcStack_4f0;
  dynamic_string *local_4e8;
  double local_4e0;
  dynamic_string local_4d8;
  undefined1 local_4c8 [16];
  bool local_4b8;
  bool bStack_4b7;
  bool bStack_4b6;
  bool bStack_4b5;
  bool local_4b4;
  bool bStack_4b3;
  progress_callback_func local_4b0;
  vector<crnlib::mip_level_*> *pvStack_4a8;
  undefined8 local_4a0;
  task_pool *local_498;
  vector<crnlib::mip_level_*> local_480;
  dynamic_string local_470;
  dynamic_string local_460;
  dynamic_string local_450;
  timer local_440;
  crn_mipmap_params local_428;
  long local_3d8;
  dynamic_string local_3d0;
  timer local_3c0;
  crn_comp_params local_3a8;
  
  bVar18 = 0;
  tVar16 = params->m_texture_type;
  memcpy(&local_3a8,&params->m_comp_params,0x378);
  pcVar14 = &params->m_mipmap_params;
  pcVar15 = &local_428;
  for (lVar12 = 0x14; lVar12 != 0; lVar12 = lVar12 + -1) {
    pcVar15->m_size_of_obj = pcVar14->m_size_of_obj;
    pcVar14 = (crn_mipmap_params *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
    pcVar15 = (crn_mipmap_params *)((long)pcVar15 + ((ulong)bVar18 * -2 + 1) * 4);
  }
  local_480.m_capacity._0_1_ = '\0';
  local_480.m_size = 0;
  params->m_status = false;
  local_4e8 = &params->m_error_message;
  local_480.m_p = (mip_level **)params;
  dynamic_string::clear(local_4e8);
  pmVar3 = params->m_pIntermediate_texture;
  if (pmVar3 != (mipmapped_texture *)0x0) {
    mipmapped_texture::~mipmapped_texture(pmVar3);
    crnlib_free(pmVar3);
    params->m_pIntermediate_texture = (mipmapped_texture *)0x0;
  }
  pmVar3 = params->m_pInput_texture;
  this = (mipmapped_texture *)crnlib_malloc(0x48);
  mipmapped_texture::mipmapped_texture(this,pmVar3);
  params->m_pIntermediate_texture = this;
  pmVar3 = params->m_pInput_texture;
  if ((params->m_unflip == true) && (bVar5 = mipmapped_texture::is_flipped(pmVar3), bVar5)) {
    console::info("Unflipping texture");
    mipmapped_texture::unflip(pmVar3,true,true);
  }
  if (params->m_y_flip == true) {
    console::info("Flipping texture on Y axis");
    bVar5 = mipmapped_texture::flip_y(pmVar3,params->m_dst_file_type == cFormatKTX);
    if (!bVar5) {
      console::warning("Failed flipping texture on Y axis");
    }
  }
  if (((params->m_dst_format == PIXEL_FMT_A8) || (params->m_dst_format == PIXEL_FMT_DXT5A)) &&
     ((pmVar3->m_comp_flags & cCompFlagAValid) == 0)) {
    console::warning(
                    "Output format is alpha-only, but input doesn\'t have alpha, so setting alpha to luminance."
                    );
    local_4c8._8_4_ = cCRNDXTQualityUber;
    local_4c8._12_4_ = cCRNDXTCompressorCRN;
    local_4b8 = true;
    bStack_4b7 = false;
    bStack_4b6 = false;
    bStack_4b5 = true;
    local_4b4 = true;
    bStack_4b3 = false;
    local_4b0 = (progress_callback_func)0x0;
    pvStack_4a8 = (vector<crnlib::mip_level_*> *)0x0;
    local_4c8._0_4_ = 0x80;
    local_4c8._4_4_ = 0;
    local_4a0._0_4_ = 0;
    local_4a0._4_4_ = 100;
    local_498 = (task_pool *)0x0;
    mipmapped_texture::convert(pmVar3,PIXEL_FMT_A8,(pack_params *)local_4c8);
    if (tVar16 == cTextureTypeNormalMap) {
      tVar16 = cTextureTypeRegularMap;
    }
  }
  pVar17 = params->m_dst_format;
  bVar5 = false;
  if (0x41315843 < (int)pVar17) {
    if ((int)pVar17 < 0x52784778) {
      if ((int)pVar17 < 0x52424741) {
        if ((pVar17 != PIXEL_FMT_DXT1A) && (pVar17 != PIXEL_FMT_ETC2A)) goto LAB_00158cf1;
      }
      else if ((pVar17 != PIXEL_FMT_DXT5_AGBR) && (pVar17 != PIXEL_FMT_DXT5_xGBR))
      goto LAB_00158cf1;
    }
    else if ((int)pVar17 < 0x53413245) {
      if ((pVar17 != PIXEL_FMT_DXT5_xGxR) && (pVar17 != PIXEL_FMT_ETC1S)) goto LAB_00158cf1;
    }
    else if ((pVar17 != PIXEL_FMT_ETC2AS) &&
            ((pVar17 != PIXEL_FMT_DXN && (pVar17 != PIXEL_FMT_DXT5_CCxY)))) goto LAB_00158cf1;
    goto LAB_00158cf3;
  }
  if ((int)pVar17 < 0x32495441) {
    if ((int)pVar17 < 0x31545844) {
      if ((pVar17 != PIXEL_FMT_ETC1) && (pVar17 != PIXEL_FMT_DXT5A)) goto LAB_00158cf1;
    }
    else if ((pVar17 != PIXEL_FMT_DXT1) && (pVar17 != PIXEL_FMT_ETC2)) goto LAB_00158cf1;
  }
  else if ((int)pVar17 < 0x33545844) {
    if ((pVar17 != PIXEL_FMT_3DC) && (pVar17 != PIXEL_FMT_DXT2)) goto LAB_00158cf1;
  }
  else if ((pVar17 != PIXEL_FMT_DXT3) && ((pVar17 != PIXEL_FMT_DXT4 && (pVar17 != PIXEL_FMT_DXT5))))
  {
LAB_00158cf1:
    bVar5 = true;
  }
LAB_00158cf3:
  if ((!bVar5) && (2 < (uint)params->m_dst_file_type)) {
    pVar17 = PIXEL_FMT_INVALID;
    console::warning(
                    "Output file format does not support DXTc - automatically choosing a non-DXT pixel format."
                    );
  }
  if ((pVar17 == PIXEL_FMT_INVALID) &&
     (pVar7 = pmVar3->m_format, pVar17 = pVar7, params->m_always_use_source_pixel_format == false))
  {
    fVar1 = pmVar3->m_source_file_type;
    fVar2 = params->m_dst_file_type;
    if (fVar2 == cFormatDDS) {
      pVar17 = PIXEL_FMT_DXT5_AGBR;
      if ((uint)fVar1 < 3) {
        pVar17 = pVar7;
      }
      if ((uint)fVar1 >= 3 && tVar16 != cTextureTypeNormalMap) {
        pVar17 = PIXEL_FMT_DXT1;
        if ((int)pVar7 < 0x41325445) {
          if ((int)pVar7 < 0x34545844) {
            if (((pVar7 == PIXEL_FMT_DXT5A) || (pVar7 == PIXEL_FMT_DXT2)) ||
               (pVar7 == PIXEL_FMT_DXT3)) {
LAB_0015a12e:
              pVar17 = PIXEL_FMT_DXT1A;
              if ((local_3a8.m_flags & 0x80) == 0) {
                pVar17 = PIXEL_FMT_DXT5;
              }
            }
          }
          else if (((pVar7 == PIXEL_FMT_DXT4) || (pVar7 == PIXEL_FMT_DXT5)) ||
                  (pVar7 == PIXEL_FMT_DXT1A)) goto LAB_0015a12e;
        }
        else if ((int)pVar7 < 0x41787878) {
          if (((pVar7 == PIXEL_FMT_ETC2A) || (pVar7 == PIXEL_FMT_A8R8G8B8)) ||
             (pVar7 == PIXEL_FMT_A8L8)) goto LAB_0015a12e;
        }
        else if (((pVar7 == PIXEL_FMT_A8) || (pVar7 == PIXEL_FMT_DXT5_AGBR)) ||
                (pVar7 == PIXEL_FMT_ETC2AS)) goto LAB_0015a12e;
      }
    }
    else if (fVar2 == cFormatKTX) {
      if (2 < (uint)fVar1) {
        if (tVar16 == cTextureTypeNormalMap) {
          pVar17 = PIXEL_FMT_A8R8G8B8;
          if ((int)pVar7 < 0x41325445) {
            if ((int)pVar7 < 0x34545844) {
              if (((pVar7 != PIXEL_FMT_DXT5A) && (pVar7 != PIXEL_FMT_DXT2)) &&
                 (pVar7 != PIXEL_FMT_DXT3)) goto LAB_0015a0ea;
            }
            else if (((pVar7 != PIXEL_FMT_DXT4) && (pVar7 != PIXEL_FMT_DXT5)) &&
                    (pVar7 != PIXEL_FMT_DXT1A)) goto LAB_0015a0ea;
          }
          else if ((int)pVar7 < 0x41787878) {
            if ((pVar7 != PIXEL_FMT_ETC2A) && (pVar7 != PIXEL_FMT_A8R8G8B8)) goto LAB_0015a0de;
          }
          else if (((pVar7 != PIXEL_FMT_A8) && (pVar7 != PIXEL_FMT_DXT5_AGBR)) &&
                  (pVar7 != PIXEL_FMT_ETC2AS)) goto LAB_0015a0ea;
        }
        else {
          bVar5 = pixel_format_helpers::has_alpha(pVar7);
          pVar17 = PIXEL_FMT_ETC1;
          if (bVar5) {
            pVar17 = PIXEL_FMT_ETC2A;
          }
        }
      }
    }
    else if (fVar2 == cFormatCRN) {
      if (tVar16 != cTextureTypeNormalMap) goto LAB_00158d27;
      if (0x41315843 < (int)pVar7) {
        if ((int)pVar7 < 0x52784778) {
          if ((int)pVar7 < 0x52424741) {
            if ((pVar7 != PIXEL_FMT_DXT1A) && (pVar7 != PIXEL_FMT_ETC2A)) goto LAB_0015a266;
          }
          else if ((pVar7 != PIXEL_FMT_DXT5_AGBR) && (pVar7 != PIXEL_FMT_DXT5_xGBR))
          goto LAB_0015a266;
        }
        else if ((int)pVar7 < 0x53413245) {
          if ((pVar7 != PIXEL_FMT_DXT5_xGxR) && (pVar7 != PIXEL_FMT_ETC1S)) goto LAB_0015a266;
        }
        else if ((pVar7 != PIXEL_FMT_ETC2AS) &&
                ((pVar7 != PIXEL_FMT_DXN && (pVar7 != PIXEL_FMT_DXT5_CCxY)))) goto LAB_0015a266;
        goto LAB_00158d27;
      }
      if ((int)pVar7 < 0x32495441) {
        if ((int)pVar7 < 0x31545844) {
          if ((pVar7 != PIXEL_FMT_ETC1) && (pVar7 != PIXEL_FMT_DXT5A)) goto LAB_0015a266;
        }
        else if ((pVar7 != PIXEL_FMT_DXT1) && (pVar7 != PIXEL_FMT_ETC2)) goto LAB_0015a266;
      }
      else if ((int)pVar7 < 0x33545844) {
        if ((pVar7 != PIXEL_FMT_3DC) && (pVar7 != PIXEL_FMT_DXT2)) goto LAB_0015a266;
      }
      else if ((pVar7 != PIXEL_FMT_DXT3) && ((pVar7 != PIXEL_FMT_DXT4 && (pVar7 != PIXEL_FMT_DXT5)))
              ) {
LAB_0015a266:
        pVar17 = PIXEL_FMT_DXT5_AGBR;
      }
    }
    else {
      if ((int)pVar7 < 0x41325445) {
        if ((int)pVar7 < 0x34545844) {
          if (((pVar7 == PIXEL_FMT_DXT5A) || (pVar7 == PIXEL_FMT_DXT2)) || (pVar7 == PIXEL_FMT_DXT3)
             ) {
LAB_0015a0af:
            pVar17 = PIXEL_FMT_A8R8G8B8;
            goto LAB_00158d27;
          }
        }
        else if (((pVar7 == PIXEL_FMT_DXT4) || (pVar7 == PIXEL_FMT_DXT5)) ||
                (pVar7 == PIXEL_FMT_DXT1A)) goto LAB_0015a0af;
      }
      else if ((int)pVar7 < 0x41787878) {
        if ((pVar7 == PIXEL_FMT_ETC2A) || (pVar7 == PIXEL_FMT_A8R8G8B8)) goto LAB_0015a0af;
LAB_0015a0de:
        if (pVar7 == PIXEL_FMT_A8L8) goto LAB_00158d27;
      }
      else if ((int)pVar7 < 0x53413245) {
        if ((pVar7 == PIXEL_FMT_A8) || (pVar7 == PIXEL_FMT_DXT5_AGBR)) goto LAB_0015a0af;
      }
      else {
        if (pVar7 == PIXEL_FMT_ETC2AS) goto LAB_0015a0af;
        if (pVar7 == PIXEL_FMT_L8) goto LAB_00158d27;
      }
LAB_0015a0ea:
      pVar17 = PIXEL_FMT_R8G8B8;
    }
  }
LAB_00158d27:
  if (pVar17 == PIXEL_FMT_DXT1A) {
    local_3a8.m_flags = local_3a8.m_flags | 0x80;
    pVar7 = PIXEL_FMT_DXT1A;
  }
  else {
    pVar7 = pVar17;
    if ((pVar17 == PIXEL_FMT_DXT1) && (pVar7 = PIXEL_FMT_DXT1A, (local_3a8.m_flags & 0x80) == 0)) {
      pVar7 = pVar17;
    }
  }
  if ((pVar7 == PIXEL_FMT_DXT1A) && (pVar7 = PIXEL_FMT_DXT1A, params->m_dst_file_type == cFormatCRN)
     ) {
    console::warning(
                    "CRN file format does not support DXT1A compressed textures - converting to DXT5 instead."
                    );
    pVar7 = PIXEL_FMT_DXT5;
  }
  if (tVar16 == cTextureTypeNormalMap) {
    local_428.m_gamma_filtering = 0;
    bVar18 = 0;
  }
  else {
    bVar18 = (byte)local_3a8.m_flags;
  }
  if ((int)pVar7 < 0x52424778) {
    if (((pVar7 == PIXEL_FMT_DXT5A) || (pVar7 == PIXEL_FMT_3DC)) || (pVar7 == PIXEL_FMT_DXT5_AGBR))
    goto LAB_00158df5;
  }
  else if ((int)pVar7 < 0x59583241) {
    if ((pVar7 == PIXEL_FMT_DXT5_xGBR) || (pVar7 == PIXEL_FMT_DXT5_xGxR)) {
LAB_00158df5:
      if ((bVar18 & 1) != 0) {
        bVar18 = 0;
        console::message(
                        "Output pixel format is swizzled or not RGB, disabling perceptual color metrics"
                        );
      }
    }
  }
  else if ((pVar7 == PIXEL_FMT_DXT5_CCxY) || (pVar7 == PIXEL_FMT_DXN)) goto LAB_00158df5;
  if ((int)pVar7 < 0x52424778) {
    if ((pVar7 == PIXEL_FMT_3DC) || (pVar7 == PIXEL_FMT_DXT5_AGBR)) goto LAB_00158e3c;
  }
  else if ((pVar7 == PIXEL_FMT_DXT5_xGBR) ||
          ((pVar7 == PIXEL_FMT_DXN || (pVar7 == PIXEL_FMT_DXT5_xGxR)))) {
LAB_00158e3c:
    if ((bVar18 & 1) == 0) {
      bVar18 = 0;
    }
    else {
      bVar18 = 0;
      console::message(
                      "Output pixel format is intended for normal maps, disabling perceptual color metrics"
                      );
    }
  }
  bVar6 = texture_file_types::supports_mipmaps(params->m_dst_file_type);
  fVar1 = params->m_dst_file_type;
  bVar5 = params->m_write_mipmaps_to_multiple_files;
  if (params->m_param_debugging == true) {
    convert_params::print(params);
    console::debug("\nTexture conversion compression parameters:");
    console::debug("          Desired bitrate: %3.3f",SUB84((double)local_3a8.m_target_bitrate,0));
    console::debug("              CRN Quality: %i",(ulong)local_3a8.m_quality_level);
    console::debug("CRN C endpoints/selectors: %u %u",
                   (ulong)local_3a8.m_crn_color_endpoint_palette_size,
                   (ulong)local_3a8.m_crn_color_selector_palette_size);
    console::debug("CRN A endpoints/selectors: %u %u",
                   (ulong)local_3a8.m_crn_alpha_endpoint_palette_size,
                   (ulong)local_3a8.m_crn_alpha_selector_palette_size);
    console::debug("     DXT both block types: %u, Alpha threshold: %u",
                   (ulong)(local_3a8.m_flags >> 3 & 1),(ulong)local_3a8.m_dxt1a_alpha_threshold);
    pcVar9 = crn_get_dxt_quality_string(local_3a8.m_dxt_quality);
    console::debug("  DXT compression quality: %s",pcVar9);
    console::debug("               Perceptual: %u, Large Blocks: %u",(ulong)(local_3a8.m_flags & 1),
                   (ulong)(local_3a8.m_flags >> 1 & 1));
    pcVar9 = get_dxt_compressor_name(local_3a8.m_dxt_compressor_type);
    console::debug("               Compressor: %s",pcVar9);
    console::debug(" Disable endpoint caching: %u",(ulong)(local_3a8.m_flags >> 5 & 1));
    console::debug("       Grayscale sampling: %u",(ulong)(local_3a8.m_flags >> 8 & 1));
    console::debug("       Max helper threads: %u",(ulong)local_3a8.m_num_helper_threads);
    console::debug("");
    console::debug("\nTexture conversion MIP-map parameters:");
    pcVar9 = crn_get_mip_mode_name(local_428.m_mode);
    console::debug("           Mode: %s",pcVar9);
    pcVar9 = crn_get_mip_filter_name(local_428.m_filter);
    console::debug("         Filter: %s",pcVar9);
    console::debug("Gamma filtering: %u, Gamma: %2.2f",SUB84((double)local_428.m_gamma,0),
                   (ulong)local_428.m_gamma_filtering);
    console::debug("     Blurriness: %2.2f",SUB84((double)local_428.m_blurriness,0));
    console::debug("    Renormalize: %u",(ulong)local_428.m_renormalize);
    console::debug("          Tiled: %u",(ulong)local_428.m_tiled);
    console::debug("     Max Levels: %u",(ulong)local_428.m_max_levels);
    console::debug(" Min level size: %u",(ulong)local_428.m_min_mip_size);
    console::debug("       window: %u %u %u %u",(ulong)local_428.m_window_left,
                   (ulong)local_428.m_window_top,(ulong)local_428.m_window_right);
    pcVar9 = crn_get_scale_mode_desc(local_428.m_scale_mode);
    console::debug("   scale mode: %s",pcVar9);
    console::debug("        scale: %f %f",SUB84((double)local_428.m_scale_x,0),
                   (double)local_428.m_scale_y);
    console::debug("        clamp: %u %u, clamp_scale: %u",(ulong)local_428.m_clamp_width,
                   (ulong)local_428.m_clamp_height,(ulong)local_428.m_clamp_scale);
    console::debug("");
  }
  bVar5 = create_texture_mipmaps
                    (pmVar3,&local_3a8,&local_428,(bool)(2 < (uint)fVar1 & bVar5 | bVar6));
  if (!bVar5) {
    params->m_status = false;
    dynamic_string::set(local_4e8,"Failed creating texture mipmaps!",0xffffffff);
    pcVar9 = (params->m_dst_filename).m_pStr;
    pcVar10 = "";
    if (pcVar9 != (char *)0x0) {
      pcVar10 = pcVar9;
    }
    remove(pcVar10);
    return false;
  }
  pVar17 = pmVar3->m_format;
  bVar5 = pVar17 != pVar7;
  if ((bVar5) && ((pVar17 == PIXEL_FMT_DXT1A || (bVar5 = true, pVar17 == PIXEL_FMT_DXT1)))) {
    bVar5 = pVar7 != PIXEL_FMT_DXT1A && pVar7 != PIXEL_FMT_DXT1;
  }
  timer::timer(&local_3c0);
  timer::start(&local_3c0);
  fVar1 = params->m_dst_file_type;
  if (fVar1 == cFormatCRN) {
LAB_0015968b:
    local_3a8.m_file_type = (crn_file_type)(fVar1 != cFormatCRN);
    local_3a8.m_pProgress_func = crn_progress_callback;
    local_3a8.m_pProgress_func_data = &local_480;
    local_3a8.m_flags = (uint)(bVar18 & 1) | local_3a8.m_flags & 0xfffffffe;
    local_3a8.m_format = pixel_format_helpers::convert_pixel_format_to_best_crn_format(pVar7);
    pcVar10 = crn_get_format_string(local_3a8.m_format);
    pcVar9 = (params->m_dst_filename).m_pStr;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    console::message("Writing %s texture to file: \"%s\"",pcVar10,pcVar9);
    pcVar9 = (params->m_dst_filename).m_pStr;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    bVar5 = mipmapped_texture::write_to_file
                      (pmVar3,pcVar9,params->m_dst_file_type,&local_3a8,(uint32 *)local_4c8,
                       (float *)&local_440,0);
    if (bVar5) {
      if (params->m_no_stats == false) {
        pcVar9 = (params->m_pInput_texture->m_name).m_pStr;
        if ((EVP_PKEY_CTX *)pcVar9 == (EVP_PKEY_CTX *)0x0) {
          pcVar9 = "";
        }
        iVar8 = convert_stats::init(stats,(EVP_PKEY_CTX *)pcVar9);
        if ((char)iVar8 == '\0') {
          pcVar9 = (params->m_pInput_texture->m_name).m_pStr;
          pcVar10 = "";
          if (pcVar9 != (char *)0x0) {
            pcVar10 = pcVar9;
          }
          console::warning("Unable to compute output statistics for file: %s",pcVar10);
        }
      }
    }
    else {
      params->m_status = false;
      dynamic_string::set(local_4e8,"Failed writing output file!",0xffffffff);
      pcVar9 = (params->m_dst_filename).m_pStr;
      pcVar10 = "";
      if (pcVar9 != (char *)0x0) {
        pcVar10 = pcVar9;
      }
      remove(pcVar10);
    }
    goto LAB_00159e54;
  }
  if (fVar1 != cFormatDDS) goto LAB_001594f5;
  if (0x41315843 < (int)pVar7) {
    if ((int)pVar7 < 0x52784778) {
      if ((int)pVar7 < 0x52424741) {
        if ((pVar7 == PIXEL_FMT_DXT1A) || (pVar7 == PIXEL_FMT_ETC2A)) goto LAB_001594d3;
      }
      else if ((pVar7 == PIXEL_FMT_DXT5_AGBR) || (pVar7 == PIXEL_FMT_DXT5_xGBR)) goto LAB_001594d3;
    }
    else if ((int)pVar7 < 0x53413245) {
      if ((pVar7 == PIXEL_FMT_DXT5_xGxR) || (pVar7 == PIXEL_FMT_ETC1S)) goto LAB_001594d3;
    }
    else if ((pVar7 == PIXEL_FMT_ETC2AS) ||
            ((pVar7 == PIXEL_FMT_DXT5_CCxY || (pVar7 == PIXEL_FMT_DXN)))) goto LAB_001594d3;
    goto LAB_001594f5;
  }
  if ((int)pVar7 < 0x32495441) {
    if ((int)pVar7 < 0x31545844) {
      if ((pVar7 == PIXEL_FMT_ETC1) || (pVar7 == PIXEL_FMT_DXT5A)) goto LAB_001594d3;
    }
    else if ((pVar7 == PIXEL_FMT_DXT1) || (pVar7 == PIXEL_FMT_ETC2)) goto LAB_001594d3;
  }
  else if ((int)pVar7 < 0x33545844) {
    if ((pVar7 == PIXEL_FMT_3DC) || (pVar7 == PIXEL_FMT_DXT2)) goto LAB_001594d3;
  }
  else if ((pVar7 == PIXEL_FMT_DXT3) || ((pVar7 == PIXEL_FMT_DXT4 || (pVar7 == PIXEL_FMT_DXT5)))) {
LAB_001594d3:
    if ((0.0 < local_3a8.m_target_bitrate) || (local_3a8.m_quality_level < 0xff)) goto LAB_0015968b;
  }
LAB_001594f5:
  if ((0.0 < local_3a8.m_target_bitrate) || (local_3a8.m_quality_level < 0xff)) {
    console::warning("Target bitrate/quality level is not supported for this output file format.\n")
    ;
  }
  if (bVar5) {
    local_4b8 = (bool)(bVar18 & 1);
    bStack_4b7 = false;
    local_4a0._0_4_ = 0;
    local_4a0._4_4_ = 100;
    local_498 = (task_pool *)0x0;
    local_4c8._12_4_ = local_3a8.m_dxt_compressor_type;
    local_4b0 = dxt_progress_callback_func;
    pvStack_4a8 = &local_480;
    local_4c8._0_4_ = local_3a8.m_dxt1a_alpha_threshold;
    local_4c8._8_4_ = local_3a8.m_dxt_quality;
    local_4b4 = (local_3a8.m_flags & 0x20) == 0;
    bStack_4b6 = (bool)((byte)(local_3a8.m_flags >> 8) & 1);
    bStack_4b5 = (local_3a8.m_flags & 0x88) != 0;
    local_4c8._4_4_ = local_3a8.m_num_helper_threads;
    bStack_4b3 = (bool)((byte)local_3a8.m_flags >> 4 & 1);
    pcVar9 = pixel_format_helpers::get_pixel_format_string(pmVar3->m_format);
    pcVar10 = pixel_format_helpers::get_pixel_format_string(pVar7);
    console::info("Converting texture format from %s to %s",pcVar9,pcVar10);
    timer::timer(&local_440);
    timer::start(&local_440);
    bVar5 = mipmapped_texture::convert(pmVar3,pVar7,(pack_params *)local_4c8);
    local_4e0 = timer::get_elapsed_secs(&local_440);
    console::info("");
    if (bVar5) {
      console::info("Texture format conversion took %3.3fs",SUB84(local_4e0,0));
    }
    else if ((char)local_480.m_capacity == '\x01') {
      params->m_canceled = true;
    }
    else {
      params->m_status = false;
      dynamic_string::set(local_4e8,"Failed converting texture to output format!",0xffffffff);
      pcVar9 = (params->m_dst_filename).m_pStr;
      pcVar10 = "";
      if (pcVar9 != (char *)0x0) {
        pcVar10 = pcVar9;
      }
      remove(pcVar10);
    }
    if (bVar5) goto LAB_0015982e;
LAB_00159e4c:
    bVar5 = false;
  }
  else {
LAB_0015982e:
    if (params->m_write_mipmaps_to_multiple_files == true) {
      if ((pmVar3->m_faces).m_size != 0) {
        bVar5 = true;
        dVar13 = 0.0;
        do {
          local_3d8 = (long)dVar13 << 4;
          local_510 = 0;
          local_4e0 = dVar13;
LAB_00159880:
          if ((pmVar3->m_faces).m_size == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = (ulong)((pmVar3->m_faces).m_p)->m_size;
          }
          if (local_510 < uVar11) {
            pcVar9 = (params->m_dst_filename).m_pStr;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = "";
            }
            dynamic_string::dynamic_string((dynamic_string *)&local_440,pcVar9);
            local_450.m_buf_size = 0;
            local_450.m_len = 0;
            local_450.m_pStr = (char *)0x0;
            local_460.m_buf_size = 0;
            local_460.m_len = 0;
            local_460.m_pStr = (char *)0x0;
            local_4d8.m_buf_size = 0;
            local_4d8.m_len = 0;
            local_4d8.m_pStr = (char *)0x0;
            local_470.m_buf_size = 0;
            local_470.m_len = 0;
            local_470.m_pStr = (char *)0x0;
            pcVar9 = (params->m_dst_filename).m_pStr;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = "";
            }
            bVar6 = file_utils::split_path(pcVar9,&local_450,&local_460,&local_4d8,&local_470);
            if (bVar6) goto LAB_0015991d;
            if ((local_470.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_470.m_pStr + -8) ^ *(uint *)(local_470.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_470.m_pStr + -0x10);
            }
            if ((local_4d8.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_4d8.m_pStr + -8) ^ *(uint *)(local_4d8.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_4d8.m_pStr + -0x10);
            }
            if ((local_460.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_460.m_pStr + -8) ^ *(uint *)(local_460.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_460.m_pStr + -0x10);
            }
            if ((local_450.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_450.m_pStr + -8) ^ *(uint *)(local_450.m_pStr + -4)) == 0xffffffff)
               ) {
              crnlib_free(local_450.m_pStr + -0x10);
            }
            if (((char *)local_440.m_stop_time != (char *)0x0) &&
               ((*(uint *)(local_440.m_stop_time + -8) ^ *(uint *)(local_440.m_stop_time + -4)) ==
                0xffffffff)) {
              crnlib_free((char *)(local_440.m_stop_time + -0x10));
            }
            goto LAB_00159e45;
          }
          dVar13 = (double)((long)local_4e0 + 1);
          bVar5 = (ulong)dVar13 < (ulong)(pmVar3->m_faces).m_size;
        } while (bVar5);
      }
    }
    else {
      pcVar9 = (params->m_dst_filename).m_pStr;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "";
      }
      console::message("Writing texture to file: \"%s\"",pcVar9);
      pcVar9 = (params->m_dst_filename).m_pStr;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "";
      }
      bVar5 = mipmapped_texture::write_to_file
                        (pmVar3,pcVar9,params->m_dst_file_type,(crn_comp_params *)0x0,(uint32 *)0x0,
                         (float *)0x0,0);
      if (!bVar5) {
        params->m_status = false;
        dynamic_string::set(local_4e8,"Failed writing output file!",0xffffffff);
        pcVar9 = (params->m_dst_filename).m_pStr;
        pcVar10 = "";
        if (pcVar9 != (char *)0x0) {
          pcVar10 = pcVar9;
        }
        remove(pcVar10);
        goto LAB_00159e4c;
      }
      if (params->m_no_stats == false) {
        pcVar9 = (params->m_pInput_texture->m_name).m_pStr;
        if ((EVP_PKEY_CTX *)pcVar9 == (EVP_PKEY_CTX *)0x0) {
          pcVar9 = "";
        }
        iVar8 = convert_stats::init(stats,(EVP_PKEY_CTX *)pcVar9);
        if ((char)iVar8 == '\0') {
          pcVar9 = (params->m_pInput_texture->m_name).m_pStr;
          pcVar10 = "";
          if (pcVar9 != (char *)0x0) {
            pcVar10 = pcVar9;
          }
          console::warning("Unable to compute output statistics for file: %s",pcVar10);
        }
      }
    }
LAB_00159e51:
    bVar5 = true;
  }
LAB_00159e54:
  console::progress("");
  if ((char)local_480.m_capacity == '\x01') {
    params->m_canceled = true;
    return false;
  }
  dVar13 = timer::get_elapsed_secs(&local_3c0);
  if (bVar5 == false) {
    local_4c8._0_4_ = 0;
    local_4c8._8_4_ = cCRNDXTQualitySuperFast;
    local_4c8._12_4_ = cCRNDXTCompressorCRN;
    pcVar9 = (params->m_dst_filename).m_pStr;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    if ((pmVar3->m_last_error).m_len == 0) {
      dynamic_string::format
                ((dynamic_string *)local_4c8,"Failed writing texture to file \"%s\"",pcVar9);
    }
    else {
      pcVar10 = (pmVar3->m_last_error).m_pStr;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "";
      }
      dynamic_string::format
                ((dynamic_string *)local_4c8,"Failed writing texture to file \"%s\", Reason: %s",
                 pcVar9,pcVar10);
    }
    pcVar9 = (char *)CONCAT44(local_4c8._12_4_,local_4c8._8_4_);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    params->m_status = false;
    dynamic_string::set(local_4e8,pcVar9,0xffffffff);
    pcVar9 = (params->m_dst_filename).m_pStr;
    pcVar10 = "";
    if (pcVar9 != (char *)0x0) {
      pcVar10 = pcVar9;
    }
    remove(pcVar10);
    lVar12 = CONCAT44(local_4c8._12_4_,local_4c8._8_4_);
    if (lVar12 != 0) {
      if ((*(uint *)(lVar12 + -8) ^ *(uint *)(lVar12 + -4)) == 0xffffffff) {
        crnlib_free((void *)(lVar12 + -0x10));
        return false;
      }
      return false;
    }
    return false;
  }
  if (params->m_param_debugging == true) {
    pcVar9 = pixel_format_helpers::get_pixel_format_string(pmVar3->m_format);
    pcVar10 = pixel_format_helpers::get_pixel_format_string(pVar7);
    console::info("Work texture format: %s, desired destination format: %s",pcVar9,pcVar10);
  }
  console::message("Texture successfully written in %3.3fs",SUB84(dVar13,0));
  if (params->m_debugging != false) {
    crnlib_print_mem_stats();
  }
  params->m_status = true;
  return bVar5;
LAB_0015991d:
  dynamic_string::dynamic_string((dynamic_string *)local_4c8,cVarArg,"_face%u_mip%u",local_4e0);
  pcVar9 = (char *)CONCAT44(local_4c8._12_4_,local_4c8._8_4_);
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "";
  }
  dynamic_string::append(&local_4d8,pcVar9);
  lVar12 = CONCAT44(local_4c8._12_4_,local_4c8._8_4_);
  if ((lVar12 != 0) && ((*(uint *)(lVar12 + -8) ^ *(uint *)(lVar12 + -4)) == 0xffffffff)) {
    crnlib_free((void *)(lVar12 + -0x10));
  }
  operator+((crnlib *)&local_3d0,&local_450,&local_460);
  operator+((crnlib *)&local_4f8,&local_3d0,&local_4d8);
  operator+((crnlib *)local_4c8,(dynamic_string *)&local_4f8,&local_470);
  dynamic_string::set((dynamic_string *)&local_440,(dynamic_string *)local_4c8,0xffffffff);
  lVar12 = CONCAT44(local_4c8._12_4_,local_4c8._8_4_);
  if ((lVar12 != 0) && ((*(uint *)(lVar12 + -8) ^ *(uint *)(lVar12 + -4)) == 0xffffffff)) {
    crnlib_free((void *)(lVar12 + -0x10));
  }
  if ((pcStack_4f0 != (char *)0x0) &&
     ((*(uint *)(pcStack_4f0 + -8) ^ *(uint *)(pcStack_4f0 + -4)) == 0xffffffff)) {
    crnlib_free(pcStack_4f0 + -0x10);
  }
  if ((local_3d0.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_3d0.m_pStr + -8) ^ *(uint *)(local_3d0.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_3d0.m_pStr + -0x10);
  }
  other = *(mip_level **)
           (*(long *)((long)&((pmVar3->m_faces).m_p)->m_p + local_3d8) + local_510 * 8);
  local_4f8 = (vector<crnlib::mip_level_*> *)0x0;
  pcStack_4f0 = (char *)0x0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&local_4f8,1,true,0x10,(object_mover)0x0,false);
  if (((ulong)pcStack_4f0 & 0xffffffff) != 1) {
    memset(local_4f8 + ((ulong)pcStack_4f0 & 0xffffffff),0,(ulong)(1 - (uint)pcStack_4f0) << 4);
  }
  pvVar4 = local_4f8;
  pcStack_4f0 = (char *)CONCAT44(pcStack_4f0._4_4_,1);
  this_00 = (mip_level *)crnlib_malloc(0x28);
  mip_level::mip_level(this_00,other);
  if (pvVar4->m_capacity <= pvVar4->m_size) {
    elemental_vector::increase_capacity
              ((elemental_vector *)pvVar4,pvVar4->m_size + 1,true,8,(object_mover)0x0,false);
  }
  pvVar4->m_p[pvVar4->m_size] = this_00;
  pvVar4->m_size = pvVar4->m_size + 1;
  mipmapped_texture::mipmapped_texture((mipmapped_texture *)local_4c8);
  mipmapped_texture::assign((mipmapped_texture *)local_4c8,(face_vec *)&local_4f8);
  console::info("Writing texture face %u mip level %u to file %s",local_4e0,local_510);
  pcVar9 = (char *)local_440.m_stop_time;
  if ((char *)local_440.m_stop_time == (char *)0x0) {
    pcVar9 = "";
  }
  bVar6 = mipmapped_texture::write_to_file
                    ((mipmapped_texture *)local_4c8,pcVar9,params->m_dst_file_type,
                     (crn_comp_params *)0x0,(uint32 *)0x0,(float *)0x0,0);
  if (!bVar6) {
    params->m_status = false;
    dynamic_string::set(local_4e8,"Failed writing output file!",0xffffffff);
    pcVar9 = (params->m_dst_filename).m_pStr;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "";
    }
    remove(pcVar9);
  }
  mipmapped_texture::~mipmapped_texture((mipmapped_texture *)local_4c8);
  pvVar4 = local_4f8;
  if (local_4f8 != (vector<crnlib::mip_level_*> *)0x0) {
    uVar11 = (ulong)pcStack_4f0 & 0xffffffff;
    if (uVar11 != 0) {
      lVar12 = 0;
      do {
        p = *(void **)((long)&pvVar4->m_p + lVar12);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar12 = lVar12 + 0x10;
      } while (uVar11 << 4 != lVar12);
    }
    crnlib_free(local_4f8);
  }
  if ((local_470.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_470.m_pStr + -8) ^ *(uint *)(local_470.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_470.m_pStr + -0x10);
  }
  if ((local_4d8.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_4d8.m_pStr + -8) ^ *(uint *)(local_4d8.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_4d8.m_pStr + -0x10);
  }
  if ((local_460.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_460.m_pStr + -8) ^ *(uint *)(local_460.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_460.m_pStr + -0x10);
  }
  if ((local_450.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_450.m_pStr + -8) ^ *(uint *)(local_450.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_450.m_pStr + -0x10);
  }
  if (((char *)local_440.m_stop_time != (char *)0x0) &&
     ((*(uint *)(local_440.m_stop_time + -8) ^ *(uint *)(local_440.m_stop_time + -4)) == 0xffffffff)
     ) {
    crnlib_free((char *)(local_440.m_stop_time + -0x10));
  }
  local_510 = local_510 + 1;
  if (!bVar6) {
LAB_00159e45:
    if (!bVar5) goto LAB_00159e51;
    goto LAB_00159e4c;
  }
  goto LAB_00159880;
}

Assistant:

bool process(convert_params& params, convert_stats& stats) {
  texture_type tex_type = params.m_texture_type;

  crn_comp_params comp_params(params.m_comp_params);
  crn_mipmap_params mipmap_params(params.m_mipmap_params);

  progress_params progress_state;
  progress_state.m_pParams = &params;
  progress_state.m_canceled = false;
  progress_state.m_start_percentage = 0;

  params.m_status = false;
  params.m_error_message.clear();

  if (params.m_pIntermediate_texture) {
    crnlib_delete(params.m_pIntermediate_texture);
    params.m_pIntermediate_texture = NULL;
  }

  params.m_pIntermediate_texture = crnlib_new<mipmapped_texture>(*params.m_pInput_texture);

  mipmapped_texture& work_tex = *params.m_pInput_texture;

  if ((params.m_unflip) && (work_tex.is_flipped())) {
    console::info("Unflipping texture");
    work_tex.unflip(true, true);
  }

  if (params.m_y_flip) {
    console::info("Flipping texture on Y axis");

    // This is awkward - if we're writing to KTX, then go ahead and properly update the work texture's orientation flags.
    // Otherwise, don't bother updating the orientation flags because the writer may then attempt to unflip the texture before writing to formats
    // that don't support flipped textures (ugh).
    const bool bOutputFormatSupportsFlippedTextures = params.m_dst_file_type == texture_file_types::cFormatKTX;
    if (!work_tex.flip_y(bOutputFormatSupportsFlippedTextures)) {
      console::warning("Failed flipping texture on Y axis");
    }
  }

  if ((params.m_dst_format != PIXEL_FMT_INVALID) && (pixel_format_helpers::is_alpha_only(params.m_dst_format))) {
    if ((work_tex.get_comp_flags() & pixel_format_helpers::cCompFlagAValid) == 0) {
      console::warning("Output format is alpha-only, but input doesn't have alpha, so setting alpha to luminance.");

      work_tex.convert(PIXEL_FMT_A8, crnlib::dxt_image::pack_params());

      if (tex_type == cTextureTypeNormalMap)
        tex_type = cTextureTypeRegularMap;
    }
  }

  pixel_format dst_format = params.m_dst_format;
  if (pixel_format_helpers::is_dxt(dst_format)) {
    if ((params.m_dst_file_type != texture_file_types::cFormatCRN) &&
        (params.m_dst_file_type != texture_file_types::cFormatDDS) &&
        (params.m_dst_file_type != texture_file_types::cFormatKTX)) {
      console::warning("Output file format does not support DXTc - automatically choosing a non-DXT pixel format.");
      dst_format = PIXEL_FMT_INVALID;
    }
  }

  if (dst_format == PIXEL_FMT_INVALID) {
    // Caller didn't specify a format to use, so try to pick something reasonable.
    // This is actually much trickier than it seems, and the current approach kind of sucks.
    dst_format = choose_pixel_format(params, comp_params, work_tex, tex_type);
  }

  if ((dst_format == PIXEL_FMT_DXT1) && (comp_params.get_flag(cCRNCompFlagDXT1AForTransparency)))
    dst_format = PIXEL_FMT_DXT1A;
  else if (dst_format == PIXEL_FMT_DXT1A)
    comp_params.set_flag(cCRNCompFlagDXT1AForTransparency, true);

  if ((dst_format == PIXEL_FMT_DXT1A) && (params.m_dst_file_type == texture_file_types::cFormatCRN)) {
    console::warning("CRN file format does not support DXT1A compressed textures - converting to DXT5 instead.");
    dst_format = PIXEL_FMT_DXT5;
  }

  const bool is_normal_map = (tex_type == cTextureTypeNormalMap);
  bool perceptual = comp_params.get_flag(cCRNCompFlagPerceptual);
  if (is_normal_map) {
    perceptual = false;
    mipmap_params.m_gamma_filtering = false;
  }

  if (pixel_format_helpers::is_pixel_format_non_srgb(dst_format)) {
    if (perceptual) {
      console::message("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");
      perceptual = false;
    }
  }

  if (pixel_format_helpers::is_normal_map(dst_format)) {
    if (perceptual)
      console::message("Output pixel format is intended for normal maps, disabling perceptual color metrics");

    perceptual = false;
  }

  bool generate_mipmaps = texture_file_types::supports_mipmaps(params.m_dst_file_type);
  if ((params.m_write_mipmaps_to_multiple_files) &&
      ((params.m_dst_file_type != texture_file_types::cFormatCRN) && (params.m_dst_file_type != texture_file_types::cFormatDDS) && (params.m_dst_file_type != texture_file_types::cFormatKTX))) {
    generate_mipmaps = true;
  }

  if (params.m_param_debugging) {
    params.print();

    print_comp_params(comp_params);
    print_mipmap_params(mipmap_params);
  }

  if (!create_texture_mipmaps(work_tex, comp_params, mipmap_params, generate_mipmaps))
    return convert_error(params, "Failed creating texture mipmaps!");

  bool formats_differ = work_tex.get_format() != dst_format;
  if (formats_differ) {
    if (pixel_format_helpers::is_dxt1(work_tex.get_format()) && pixel_format_helpers::is_dxt1(dst_format))
      formats_differ = false;
  }

  bool status = false;

  timer t;
  t.start();

  if ((params.m_dst_file_type == texture_file_types::cFormatCRN) ||
      ((params.m_dst_file_type == texture_file_types::cFormatDDS) && (pixel_format_helpers::is_dxt(dst_format)) &&
       //((formats_differ) || (comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel))
       ((comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel)))) {
    status = write_compressed_texture(work_tex, params, comp_params, dst_format, progress_state, perceptual, stats);
  } else {
    if ((comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel)) {
      console::warning("Target bitrate/quality level is not supported for this output file format.\n");
    }
    status = convert_and_write_normal_texture(work_tex, params, comp_params, dst_format, progress_state, formats_differ, perceptual, stats);
  }

  console::progress("");

  if (progress_state.m_canceled) {
    params.m_canceled = true;
    return false;
  }

  double total_write_time = t.get_elapsed_secs();

  if (status) {
    if (params.m_param_debugging)
      console::info("Work texture format: %s, desired destination format: %s", pixel_format_helpers::get_pixel_format_string(work_tex.get_format()), pixel_format_helpers::get_pixel_format_string(dst_format));

    console::message("Texture successfully written in %3.3fs", total_write_time);
  } else {
    dynamic_string str;

    if (work_tex.get_last_error().is_empty())
      str.format("Failed writing texture to file \"%s\"", params.m_dst_filename.get_ptr());
    else
      str.format("Failed writing texture to file \"%s\", Reason: %s", params.m_dst_filename.get_ptr(), work_tex.get_last_error().get_ptr());

    return convert_error(params, str.get_ptr());
  }

  if (params.m_debugging) {
    crnlib_print_mem_stats();
  }

  params.m_status = true;
  return true;
}